

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

string * testing::internal::GetTypeName<char>(void)

{
  string *in_RDI;
  char *readable_name;
  int status;
  char *name;
  string *name_str;
  char *local_50;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  int local_14;
  char *local_10;
  
  local_10 = std::type_info::name((type_info *)&char::typeinfo);
  local_14 = 0;
  local_20 = (char *)__cxa_demangle(local_10,0,0,&local_14);
  local_21 = 0;
  local_50 = local_20;
  if (local_14 != 0) {
    local_50 = local_10;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_50,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  free(local_20);
  return in_RDI;
}

Assistant:

std::string GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#   endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}